

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * CTcPrsOpUnary::parse_bnot(CTcPrsNode *subexpr)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  CTcPrsNode *pCVar4;
  char *pcVar5;
  
  iVar2 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    pCVar4 = (CTcPrsNode *)CTcPrsMem::alloc(G_prsmem,0x10);
    pCVar4[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)subexpr;
    (pCVar4->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00357948;
  }
  else {
    iVar2 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subexpr);
    pCVar4 = subexpr;
    if (*(int *)CONCAT44(extraout_var_00,iVar2) == 3) {
      iVar2 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subexpr);
      iVar3 = (*(subexpr->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])(subexpr);
      uVar1 = *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 8);
      *(undefined4 *)CONCAT44(extraout_var_01,iVar2) = 3;
      *(ulong *)((undefined4 *)CONCAT44(extraout_var_01,iVar2) + 2) = ~uVar1;
    }
    else {
      pcVar5 = CTcTokenizer::get_op_text(TOKT_BNOT);
      CTcTokenizer::log_error(0x2b01,pcVar5);
    }
  }
  return pCVar4;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::parse_bnot(CTcPrsNode *subexpr)
{
    /* 
     *   if the underlying expression is a constant value, apply the
     *   operator 
     */
    if (subexpr->is_const())
    {
        /* we need an integer - log an error if it's not */
        if (subexpr->get_const_val()->get_type() != TC_CVT_INT)
            G_tok->log_error(TCERR_CONST_UNARY_REQ_NUM,
                             G_tok->get_op_text(TOKT_BNOT));
        else
            subexpr->get_const_val()
                ->set_int(~subexpr->get_const_val()->get_val_int());

        /* return the updated value */
        return subexpr;
    }
    
    /* create the bitwise NOT node */
    return new CTPNBNot(subexpr);
}